

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

any __thiscall cs_impl::any::make<cs::type_id,std::type_info_const&>(any *this,type_info *args)

{
  proxy *ppVar1;
  int local_1c;
  holder<cs::type_id> *local_18;
  
  local_1c = 1;
  local_18 = cs::
             allocator_type<cs_impl::any::holder<cs::type_id>,64ul,cs_impl::default_allocator_provider>
             ::alloc<std::type_info_const&>
                       ((allocator_type<cs_impl::any::holder<cs::type_id>,64ul,cs_impl::default_allocator_provider>
                         *)holder<cs::type_id>::allocator,args);
  ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
           alloc<int,cs_impl::any::holder<cs::type_id>*>
                     ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>
                       *)allocator,&local_1c,&local_18);
  this->mDat = ppVar1;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}